

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_>
::fulfill(AdapterPromiseNode<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_>
          *this,Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                *value)

{
  ExceptionOr<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
  local_180;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_180.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_180.value.ptr.isSet = true;
    local_180.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (value->super_PromiseBase).node.disposer;
    local_180.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (value->super_PromiseBase).node.ptr;
    (value->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    ExceptionOr<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
    ::operator=(&this->result,&local_180);
    ExceptionOr<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
    ::~ExceptionOr(&local_180);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }